

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O3

void __thiscall agg::bspline::prepare(bspline *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double *__s;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  double *__s_00;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  uVar7 = this->m_num;
  lVar6 = (long)(int)uVar7;
  if (2 < lVar6) {
    uVar9 = (ulong)uVar7;
    __s = (this->m_am).m_array;
    lVar11 = 0;
    memset(__s,0,uVar9 * 8);
    __s_00 = (double *)operator_new__(uVar9 * 0x18);
    memset(__s_00,0,(uVar9 * 3 & 0xffffffff) << 3);
    pdVar1 = __s_00 + uVar7 * 2;
    uVar8 = (ulong)(uVar7 - 1);
    pdVar4 = this->m_x;
    pdVar5 = this->m_y;
    dVar13 = pdVar4[1] - *pdVar4;
    dVar12 = (pdVar5[1] - *pdVar5) / dVar13;
    dVar14 = pdVar5[1];
    dVar15 = pdVar4[1];
    do {
      dVar2 = *(double *)((long)pdVar4 + lVar11 + 0x10);
      dVar15 = dVar2 - dVar15;
      dVar3 = *(double *)((long)pdVar5 + lVar11 + 0x10);
      dVar16 = (dVar3 - dVar14) / dVar15;
      dVar14 = dVar15 / (dVar13 + dVar15);
      *(double *)((long)__s_00 + lVar11 + 8) = dVar14;
      *(double *)((long)__s_00 + lVar11 + uVar9 * 8 + 8) = 1.0 - dVar14;
      *(double *)((long)pdVar1 + lVar11 + 8) = ((dVar16 - dVar12) * 6.0) / (dVar13 + dVar15);
      lVar11 = lVar11 + 8;
      dVar12 = dVar16;
      dVar13 = dVar15;
      dVar14 = dVar3;
      dVar15 = dVar2;
    } while (uVar8 * 8 + -8 != lVar11);
    dVar12 = *__s_00;
    dVar13 = *pdVar1;
    uVar10 = 1;
    do {
      dVar14 = __s_00[uVar9 + uVar10];
      dVar15 = 1.0 / (dVar12 * dVar14 + 2.0);
      dVar12 = -dVar15 * __s_00[uVar10];
      __s_00[uVar10] = dVar12;
      dVar13 = (pdVar1[uVar10] - dVar13 * dVar14) * dVar15;
      pdVar1[uVar10] = dVar13;
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
    __s[uVar8] = 0.0;
    dVar12 = pdVar1[lVar6 + -2];
    uVar8 = lVar6 - 2;
    __s_00[uVar8 & 0xffffffff] = dVar12;
    __s[uVar8 & 0xffffffff] = dVar12;
    uVar9 = (ulong)(int)(uVar7 - 3);
    do {
      uVar10 = uVar9 & 0xffffffff;
      dVar12 = __s_00[uVar10] * __s_00[(int)uVar9 + 1] + pdVar1[uVar9];
      __s_00[uVar10] = dVar12;
      __s[uVar10] = dVar12;
      uVar9 = uVar9 - 1;
      uVar7 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar7;
    } while (uVar7 != 0);
    operator_delete__(__s_00);
  }
  this->m_last_idx = -1;
  return;
}

Assistant:

void bspline::prepare()
    {
        if(m_num > 2)
        {
            int i, k, n1;
            double* temp; 
            double* r; 
            double* s;
            double h, p, d, f, e;
    
            for(k = 0; k < m_num; k++) 
            {
                m_am[k] = 0.0;
            }

            n1 = 3 * m_num;

            pod_array<double> al(n1);
            temp = &al[0];

            for(k = 0; k < n1; k++) 
            {
                temp[k] = 0.0;
            }

            r = temp + m_num;
            s = temp + m_num * 2;

            n1 = m_num - 1;
            d = m_x[1] - m_x[0];
            e = (m_y[1] - m_y[0]) / d;

            for(k = 1; k < n1; k++) 
            {
                h     = d;
                d     = m_x[k + 1] - m_x[k];
                f     = e;
                e     = (m_y[k + 1] - m_y[k]) / d;
                al[k] = d / (d + h);
                r[k]  = 1.0 - al[k];
                s[k]  = 6.0 * (e - f) / (h + d);
            }

            for(k = 1; k < n1; k++) 
            {
                p = 1.0 / (r[k] * al[k - 1] + 2.0);
                al[k] *= -p;
                s[k] = (s[k] - r[k] * s[k - 1]) * p; 
            }

            m_am[n1]     = 0.0;
            al[n1 - 1]   = s[n1 - 1];
            m_am[n1 - 1] = al[n1 - 1];

            for(k = n1 - 2, i = 0; i < m_num - 2; i++, k--) 
            {
                al[k]   = al[k] * al[k + 1] + s[k];
                m_am[k] = al[k];
            }
        }
        m_last_idx = -1;
    }